

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_atom.c
# Opt level: O2

void atom_string(t_atom *a,char *buf,uint bufsize)

{
  bool bVar1;
  size_t sVar2;
  byte bVar3;
  long lVar4;
  char *bp;
  byte *__src;
  byte *pbVar5;
  char tbuf [30];
  
  switch(a->a_type) {
  case A_FLOAT:
    sprintf(tbuf,"%g",(double)(a->a_w).w_float);
    sVar2 = strlen(tbuf);
    if (sVar2 < bufsize - 1) {
      strcpy(buf,tbuf);
      return;
    }
    if ((a->a_w).w_float <= 0.0 && (a->a_w).w_float != 0.0) {
      buf[0] = '-';
      buf[1] = '\0';
      return;
    }
    buf[0] = '+';
    buf[1] = '\0';
    return;
  case A_SYMBOL:
  case A_DOLLSYM:
    __src = (byte *)((a->a_w).w_symbol)->s_name;
    lVar4 = 0;
    bVar1 = false;
    break;
  case A_POINTER:
    builtin_strncpy(buf,"(pointer)",10);
    return;
  case A_SEMI:
    buf[0] = ';';
    buf[1] = '\0';
    return;
  case A_COMMA:
    buf[0] = ',';
    buf[1] = '\0';
    return;
  default:
    bug("atom_string");
    return;
  case A_DOLLAR:
    sprintf(buf,"$%d",(ulong)(uint)(a->a_w).w_index);
    return;
  }
  do {
    bVar3 = __src[lVar4];
    if ((bVar3 - 0x20 < 0x3d) && ((0x1000000008001001U >> ((ulong)(bVar3 - 0x20) & 0x3f) & 1) != 0))
    {
LAB_00161eb3:
      bVar1 = true;
    }
    else {
      if (bVar3 == 0) break;
      if (((a->a_type == A_SYMBOL) && (bVar3 == 0x24)) && ((byte)(__src[lVar4 + 1] - 0x30) < 10))
      goto LAB_00161eb3;
    }
    lVar4 = lVar4 + 1;
  } while( true );
  if (bVar1) {
    pbVar5 = (byte *)(buf + (bufsize - 2));
    for (; bVar3 = *__src, buf < pbVar5; buf = (char *)((byte *)buf + 1)) {
      if ((bVar3 - 0x20 < 0x3d) &&
         ((0x1000000008001001U >> ((ulong)(bVar3 - 0x20) & 0x3f) & 1) != 0)) {
LAB_00161f04:
        *buf = 0x5c;
        buf = (char *)((byte *)buf + 1);
        bVar3 = *__src;
      }
      else {
        if (bVar3 == 0) goto LAB_00161f3e;
        if (((bVar3 == 0x24) && (a->a_type == A_SYMBOL)) &&
           (bVar3 = 0x24, (byte)(__src[1] - 0x30) < 10)) goto LAB_00161f04;
      }
      __src = __src + 1;
      *buf = bVar3;
    }
    if (bVar3 != 0) {
      *buf = 0x2a;
      buf = (char *)((byte *)buf + 1);
    }
LAB_00161f3e:
    *buf = 0;
  }
  else {
    if ((uint)lVar4 < bufsize - 1) {
      strcpy(buf,(char *)__src);
      return;
    }
    strncpy(buf,(char *)__src,(ulong)(bufsize - 2));
    (buf + (bufsize - 2))[0] = '*';
    (buf + (bufsize - 2))[1] = '\0';
  }
  return;
}

Assistant:

void atom_string(const t_atom *a, char *buf, unsigned int bufsize)
{
    char tbuf[30];
    switch(a->a_type)
    {
    case A_SEMI: strcpy(buf, ";"); break;
    case A_COMMA: strcpy(buf, ","); break;
    case A_POINTER:
        strcpy(buf, "(pointer)");
        break;
    case A_FLOAT:
        sprintf(tbuf, "%g", a->a_w.w_float);
        if (strlen(tbuf) < bufsize-1) strcpy(buf, tbuf);
        else if (a->a_w.w_float < 0) strcpy(buf, "-");
        else  strcpy(buf, "+");
        break;
    case A_SYMBOL:
    case A_DOLLSYM:
    {
        const char *sp;
        unsigned int len;
        int quote;
        for (sp = a->a_w.w_symbol->s_name, len = 0, quote = 0; *sp; sp++, len++)
            if (*sp == ';' || *sp == ',' || *sp == '\\' || *sp == ' ' ||
                (a->a_type == A_SYMBOL && *sp == '$' &&
                    sp[1] >= '0' && sp[1] <= '9'))
                        quote = 1;
        if (quote)
        {
            char *bp = buf, *ep = buf + (bufsize-2);
            sp = a->a_w.w_symbol->s_name;
            while (bp < ep && *sp)
            {
                if (*sp == ';' || *sp == ',' || *sp == '\\' || *sp == ' ' ||
                    (a->a_type == A_SYMBOL && *sp == '$' &&
                        sp[1] >= '0' && sp[1] <= '9'))
                            *bp++ = '\\';
                *bp++ = *sp++;
            }
            if (*sp) *bp++ = '*';
            *bp = 0;
            /* post("quote %s -> %s", a->a_w.w_symbol->s_name, buf); */
        }
        else
        {
            if (len < bufsize-1) strcpy(buf, a->a_w.w_symbol->s_name);
            else
            {
                strncpy(buf, a->a_w.w_symbol->s_name, bufsize - 2);
                strcpy(buf + (bufsize - 2), "*");
            }
        }
    }
        break;
    case A_DOLLAR:
        sprintf(buf, "$%d", a->a_w.w_index);
        break;
    default:
        bug("atom_string");
    }
}